

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall mjs::parser::parse_left_hand_side_expression(parser *this)

{
  parser *this_00;
  element_type *peVar1;
  _Head_base<0UL,_mjs::expression_*,_false> _Var2;
  undefined8 uVar3;
  undefined4 uVar4;
  parser *in_RCX;
  pointer *__ptr;
  parser *in_RSI;
  _Head_base<0UL,_mjs::expression_*,_false> local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b0;
  undefined1 local_a4 [4];
  undefined1 local_a0 [16];
  undefined1 local_90 [56];
  token local_58;
  
  parse_member_expression(this);
  this_00 = (parser *)(local_90 + 0x10);
  while( true ) {
    while( true ) {
      while ((in_RSI->current_token_).type_ == lparen) {
        parse_argument_list((expression_list *)this_00,in_RSI);
        in_RCX = this_00;
        make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                  ((parser *)local_a0,
                   (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                   (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                    *)this);
        uVar3 = local_a0._0_8_;
        local_a0._0_8_ = (element_type *)0x0;
        peVar1 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)uVar3;
        if (peVar1 != (element_type *)0x0) {
          (**(code **)(*(long *)peVar1 + 8))();
          if ((element_type *)local_a0._0_8_ != (element_type *)0x0) {
            (**(code **)(*(long *)local_a0._0_8_ + 8))();
          }
        }
        local_a0._0_8_ = (element_type *)0x0;
        std::
        vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   *)this_00);
      }
      accept(this_00,(int)in_RSI,(sockaddr *)0x32,(socklen_t *)in_RCX);
      uVar4 = local_90._16_4_;
      token::destroy((token *)this_00);
      if (uVar4 == eof) break;
      parse_expression(this_00);
      expect(&local_58,in_RSI,rbracket,"parse_left_hand_side_expression",0x2f3);
      token::destroy(&local_58);
      local_b8._M_head_impl._0_4_ = 0x32;
      in_RCX = this;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_a0,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&local_b8,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this);
      uVar3 = local_a0._0_8_;
      local_a0._0_8_ = (element_type *)0x0;
      peVar1 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar3;
      if (peVar1 != (element_type *)0x0) {
        (**(code **)(*(long *)peVar1 + 8))();
        if ((element_type *)local_a0._0_8_ != (element_type *)0x0) {
          (**(code **)(*(long *)local_a0._0_8_ + 8))();
        }
      }
      if ((long *)CONCAT44(local_90._20_4_,local_90._16_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_90._20_4_,local_90._16_4_) + 8))();
      }
    }
    accept(this_00,(int)in_RSI,(sockaddr *)0x25,(socklen_t *)in_RCX);
    uVar4 = local_90._16_4_;
    token::destroy((token *)this_00);
    if (uVar4 == eof) break;
    local_a4 = (undefined1  [4])0x25;
    get_identifier_name_abi_cxx11_
              ((wstring *)local_a0,in_RSI,"parse_left_hand_side_expression",0x2f6);
    token::token((token *)this_00,string_literal,(wstring *)local_a0);
    make_expression<mjs::literal_expression,mjs::token>((parser *)&local_b0,(token *)in_RSI);
    in_RCX = this;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)&local_b8,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_a4,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)this);
    _Var2._M_head_impl = local_b8._M_head_impl;
    local_b8._M_head_impl = (expression *)0x0;
    peVar1 = (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    (this->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var2._M_head_impl;
    if (peVar1 != (element_type *)0x0) {
      (**(code **)(*(long *)peVar1 + 8))();
      if ((element_type *)local_b8._M_head_impl != (element_type *)0x0) {
        (*((local_b8._M_head_impl)->super_syntax_node)._vptr_syntax_node[1])();
      }
    }
    local_b8._M_head_impl = (expression *)0x0;
    if (local_b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (*(local_b0._M_pi)->_vptr__Sp_counted_base[1])();
    }
    local_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    token::destroy((token *)this_00);
    if ((element_type *)local_a0._0_8_ != (element_type *)local_90) {
      operator_delete((void *)local_a0._0_8_,local_90._0_8_ * 4 + 4);
    }
  }
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
}

Assistant:

expression_ptr parse_left_hand_side_expression() {
        // LeftHandSideExpression :
        //  NewExpression
        //  CallExpression

        // NewExpression :
        //  MemberExpression
        //  new NewExpression

        // CallExpression :
        //  MemberExpression Arguments
        //  CallExpression Arguments
        //  CallExpression [ Expression ]
        //  CallExpression . Identifier (IdentifierName in ES5+)

        // MemberExpression:
        //   PrimaryExpression
        //   MemberExpression [ Expression ]
        //   MemberExpression .  Identifier (IdentifierName in ES5+)
        //   new MemberExpression Arguments

        auto m = parse_member_expression();
        for (;;) {
            if (current_token_type() == token_type::lparen) {
                m = make_expression<call_expression>(std::move(m), parse_argument_list());
            } else if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                m = make_expression<binary_expression>(token_type::lbracket, std::move(m), std::move(e));
            } else if (accept(token_type::dot)) {
                m = make_expression<binary_expression>(token_type::dot, std::move(m), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return m;
            }
        }
    }